

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O3

bool despot::option::Parser::workhorse
               (bool gnu,Descriptor *usage,int numargs,char **args,Action *action,
               bool single_minus_longopt,bool print_errors,int min_abbr_len)

{
  char *pcVar1;
  char *pcVar2;
  char **ppcVar3;
  char cVar4;
  Descriptor *pDVar5;
  byte bVar6;
  int iVar7;
  ArgStatus AVar8;
  int iVar9;
  char *temp_1;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  long lVar16;
  char *pcVar17;
  char cVar18;
  Descriptor *ctx;
  char *unaff_R13;
  ulong unaff_R15;
  Option option;
  uint local_a8;
  int local_a4;
  char **local_88;
  Option local_60;
  
  if (numargs == 0 || args == (char **)0x0) {
    iVar7 = 0;
LAB_00162c1b:
    numargs = 0;
LAB_00162c1e:
    iVar7 = (*action->_vptr_Action[3])(action,(ulong)(uint)(numargs + iVar7),args + -(long)iVar7);
    return (bool)(char)iVar7;
  }
  iVar7 = 0;
  local_88 = args;
LAB_00162c5b:
  pcVar12 = *local_88;
  if (pcVar12 != (char *)0x0) {
    if (*pcVar12 == '-') {
      cVar18 = pcVar12[1];
      if (cVar18 != '-') {
        if (cVar18 != '\0') goto LAB_00162c95;
        goto LAB_00162c7a;
      }
      if (pcVar12[2] != '\0') {
LAB_00162c95:
        pcVar15 = (char *)(ulong)(cVar18 != '-');
        pcVar13 = pcVar12 + 2;
        if (cVar18 != '-') {
          pcVar13 = pcVar12 + 1;
        }
        local_a4 = numargs;
        bVar6 = single_minus_longopt;
LAB_00162ccf:
        pcVar14 = pcVar12;
LAB_00162cd4:
        if ((byte)(~bVar6 & (byte)pcVar15) == 0) {
          pcVar12 = usage->longopt;
          if (pcVar12 == (char *)0x0) {
            unaff_R15 = 0;
          }
          else {
            pcVar17 = pcVar12;
            uVar11 = 0;
            do {
              lVar10 = 0;
              do {
                pcVar1 = pcVar17 + lVar10;
                if (*pcVar1 == '\0') {
                  unaff_R15 = uVar11;
                  if ((pcVar13[lVar10] == '\0') || (pcVar13[lVar10] == '=')) goto LAB_00162e10;
                  break;
                }
                pcVar2 = pcVar13 + lVar10;
                lVar10 = lVar10 + 1;
              } while (*pcVar1 == *pcVar2);
              unaff_R15 = uVar11 + 1;
              pcVar17 = usage[uVar11 + 1].longopt;
              uVar11 = unaff_R15;
            } while (pcVar17 != (char *)0x0);
            if (0 < min_abbr_len && pcVar12 != (char *)0x0) {
              lVar10 = 1;
              uVar11 = 0;
              do {
                cVar18 = *pcVar12;
                pcVar17 = pcVar13;
                if (cVar18 != '\0') {
                  lVar16 = 0;
                  do {
                    if (cVar18 != pcVar13[lVar16]) {
                      if (lVar16 < (long)(ulong)(uint)min_abbr_len) goto LAB_00162d95;
                      break;
                    }
                    cVar18 = pcVar12[lVar16 + 1];
                    lVar16 = lVar16 + 1;
                  } while (cVar18 != '\0');
                  pcVar17 = pcVar13 + lVar16;
                }
                if ((*pcVar17 == '\0') || (*pcVar17 == '=')) {
                  pcVar12 = usage[(int)uVar11 + 1].longopt;
                  goto LAB_00162dbc;
                }
LAB_00162d95:
                pcVar12 = usage[uVar11 + 1].longopt;
                lVar10 = lVar10 + 1;
                uVar11 = uVar11 + 1;
              } while (pcVar12 != (char *)0x0);
            }
          }
          goto LAB_00162e10;
        }
        goto LAB_00162e4a;
      }
      if (0 < iVar7) {
        pcVar12 = *local_88;
        lVar10 = 0;
        do {
          local_88[lVar10] = local_88[lVar10 + -1];
          local_88[lVar10 + -1] = pcVar12;
          lVar10 = lVar10 + -1;
        } while (-iVar7 < lVar10);
      }
      local_88 = local_88 + 1;
      numargs = numargs - (uint)(0 < numargs);
    }
    else {
LAB_00162c7a:
      if (gnu) {
        iVar7 = iVar7 + 1;
        goto LAB_00163051;
      }
    }
  }
  args = local_88;
  if (0 < numargs) {
    if (*local_88 == (char *)0x0) {
      numargs = 0;
    }
    goto LAB_00162c1e;
  }
  if (numargs < 0) {
    lVar10 = 0;
    do {
      ppcVar3 = local_88 + lVar10;
      lVar10 = lVar10 + 1;
    } while (*ppcVar3 != (char *)0x0);
    numargs = (int)lVar10 + -1;
    goto LAB_00162c1e;
  }
  goto LAB_00162c1b;
LAB_00162dbc:
  if (pcVar12 == (char *)0x0) goto LAB_00162e05;
  cVar18 = *pcVar12;
  pcVar17 = pcVar13;
  if (cVar18 != '\0') {
    lVar16 = 0;
    do {
      if (cVar18 != pcVar13[lVar16]) {
        if (lVar16 < (long)(ulong)(uint)min_abbr_len) goto LAB_00162df7;
        break;
      }
      cVar18 = pcVar12[lVar16 + 1];
      lVar16 = lVar16 + 1;
    } while (cVar18 != '\0');
    pcVar17 = pcVar13 + lVar16;
  }
  if ((*pcVar17 == '\0') || (*pcVar17 == '=')) goto LAB_00162e10;
LAB_00162df7:
  pcVar12 = usage[lVar10 + 1].longopt;
  lVar10 = lVar10 + 1;
  goto LAB_00162dbc;
LAB_00162e05:
  unaff_R15 = uVar11 & 0xffffffff;
LAB_00162e10:
  pcVar12 = pcVar13;
  if (usage[(int)unaff_R15].longopt != (char *)0x0) {
    pcVar15 = (char *)0x0;
  }
  do {
    unaff_R13 = pcVar12 + 1;
    cVar18 = *pcVar12;
    if (cVar18 == '\0') {
      if (numargs == 1) {
        unaff_R13 = (char *)0x0;
      }
      else {
        unaff_R13 = local_88[1];
      }
      break;
    }
    pcVar12 = unaff_R13;
  } while (cVar18 != '=');
LAB_00162e4a:
  pcVar12 = pcVar14;
  if (pcVar15 != (char *)0x0) {
    cVar18 = pcVar14[1];
    if (cVar18 == '\0') goto LAB_0016301c;
    pcVar12 = usage->shortopt;
    unaff_R15 = 0;
    while (pcVar12 != (char *)0x0) {
      do {
        cVar4 = *pcVar12;
        if (cVar4 == '\0') break;
        pcVar12 = pcVar12 + 1;
      } while (cVar4 != cVar18);
      if (cVar4 == cVar18) break;
      pcVar12 = usage[unaff_R15 + 1].shortopt;
      unaff_R15 = unaff_R15 + 1;
    }
    pcVar12 = pcVar14 + 1;
    unaff_R13 = pcVar14 + 2;
    if (pcVar14[2] == '\0') {
      unaff_R13 = (char *)0x0;
    }
    if ((numargs != 1) && (pcVar14[2] == '\0')) {
      unaff_R13 = local_88[1];
    }
  }
  local_a8 = (uint)pcVar15;
  if (usage[(int)unaff_R15].shortopt != (char *)0x0) goto LAB_0016300b;
  unaff_R15 = 0;
  pcVar14 = usage->shortopt;
  ctx = usage;
  while (pcVar14 != (char *)0x0) {
    if ((*pcVar14 == '\0') && (*ctx->longopt == '\0')) goto LAB_00162f0d;
    pDVar5 = ctx + 1;
    unaff_R15 = (ulong)((int)unaff_R15 + 1);
    ctx = ctx + 1;
    pcVar14 = pDVar5->shortopt;
  }
  bVar6 = 0;
  pcVar14 = pcVar12;
  if (pcVar15 == (char *)0x0) goto LAB_0016301c;
  goto LAB_00162cd4;
LAB_0016301c:
  numargs = local_a4;
  if (0 < iVar7) {
    pcVar12 = *local_88;
    lVar10 = 0;
    do {
      local_88[lVar10] = local_88[lVar10 + -1];
      local_88[lVar10 + -1] = pcVar12;
      lVar10 = lVar10 + -1;
    } while (-iVar7 < lVar10);
  }
LAB_00163051:
  local_88 = local_88 + 1;
  numargs = numargs - (uint)(0 < numargs);
  args = local_88;
  if (numargs == 0) goto LAB_00162c1b;
  goto LAB_00162c5b;
LAB_0016300b:
  ctx = usage + (int)unaff_R15;
LAB_00162f0d:
  Option::init(&local_60,(EVP_PKEY_CTX *)ctx);
  AVar8 = (*ctx->check_arg)(&local_60,print_errors);
  switch(AVar8) {
  case ARG_NONE:
  case ARG_IGNORE:
    local_60.arg = (char *)0x0;
    break;
  case ARG_OK:
    local_a8 = 0;
    if ((numargs != 1) && (unaff_R13 != (char *)0x0)) {
      if (unaff_R13 == local_88[1]) {
        if (0 < iVar7) {
          pcVar15 = *local_88;
          lVar10 = 0;
          do {
            local_88[lVar10] = local_88[lVar10 + -1];
            local_88[lVar10 + -1] = pcVar15;
            lVar10 = lVar10 + -1;
          } while (-iVar7 < lVar10);
        }
        local_88 = local_88 + 1;
        local_a4 = local_a4 - (uint)(0 < local_a4);
      }
      local_a8 = 0;
    }
    break;
  case ARG_ILLEGAL:
    goto LAB_00162c3c;
  }
  iVar9 = (*action->_vptr_Action[2])(action,&local_60);
  if ((char)iVar9 != '\0') {
    bVar6 = 0;
    pcVar15 = (char *)(ulong)local_a8;
    if (local_a8 == 0) goto LAB_0016301c;
    goto LAB_00162ccf;
  }
LAB_00162c3c:
  return false;
}

Assistant:

inline bool Parser::workhorse(bool gnu, const Descriptor usage[], int numargs,
	const char** args, Action& action, bool single_minus_longopt,
	bool print_errors, int min_abbr_len) {
	// protect against NULL pointer
	if (args == 0)
		numargs = 0;

	int nonops = 0;

	while (numargs != 0 && *args != 0) {
		const char* param = *args; // param can be --long-option, -srto or non-option argument

		// in POSIX mode the first non-option argument terminates the option list
		// a lone minus character is a non-option argument
		if (param[0] != '-' || param[1] == 0) {
			if (gnu) {
				++nonops;
				++args;
				if (numargs > 0)
					--numargs;
				continue;
			} else
				break;
		}

		// -- terminates the option list. The -- itself is skipped.
		if (param[1] == '-' && param[2] == 0) {
			shift(args, nonops);
			++args;
			if (numargs > 0)
				--numargs;
			break;
		}

		bool handle_short_options;
		const char* longopt_name;
		if (param[1] == '-') // if --long-option
			{
			handle_short_options = false;
			longopt_name = param + 2;
		} else {
			handle_short_options = true;
			longopt_name = param + 1; //for testing a potential -long-option
		}

		bool try_single_minus_longopt = single_minus_longopt;
		bool have_more_args = (numargs > 1 || numargs < 0); // is referencing argv[1] valid?

		do // loop over short options in group, for long options the body is executed only once
		{
			int idx;

			const char* optarg;

			/******************** long option **********************/
			if (handle_short_options == false || try_single_minus_longopt) {
				idx = 0;
				while (usage[idx].longopt != 0
					&& !streq(usage[idx].longopt, longopt_name))
					++idx;

				if (usage[idx].longopt == 0 && min_abbr_len > 0) // if we should try to match abbreviated long options
					{
					int i1 = 0;
					while (usage[i1].longopt != 0
						&& !streqabbr(usage[i1].longopt, longopt_name,
							min_abbr_len))
						++i1;
					if (usage[i1].longopt != 0) { // now test if the match is unambiguous by checking for another match
						int i2 = i1 + 1;
						while (usage[i2].longopt != 0
							&& !streqabbr(usage[i2].longopt, longopt_name,
								min_abbr_len))
							++i2;

						if (usage[i2].longopt == 0) // if there was no second match it's unambiguous, so accept i1 as idx
							idx = i1;
					}
				}

				// if we found something, disable handle_short_options (only relevant if single_minus_longopt)
				if (usage[idx].longopt != 0)
					handle_short_options = false;

				try_single_minus_longopt = false; // prevent looking for longopt in the middle of shortopt group

				optarg = longopt_name;
				while (*optarg != 0 && *optarg != '=')
					++optarg;
				if (*optarg == '=') // attached argument
					++optarg;
				else
					// possibly detached argument
					optarg = (have_more_args ? args[1] : 0);
			}

			/************************ short option ***********************************/
			if (handle_short_options) {
				if (*++param == 0) // point at the 1st/next option character
					break; // end of short option group

				idx = 0;
				while (usage[idx].shortopt != 0
					&& !instr(*param, usage[idx].shortopt))
					++idx;

				if (param[1] == 0) // if the potential argument is separate
					optarg = (have_more_args ? args[1] : 0);
				else
					// if the potential argument is attached
					optarg = param + 1;
			}

			const Descriptor* descriptor = &usage[idx];

			if (descriptor->shortopt == 0) /**************  unknown option ********************/
			{
				// look for dummy entry (shortopt == "" and longopt == "") to use as Descriptor for unknown options
				idx = 0;
				while (usage[idx].shortopt != 0
					&& (usage[idx].shortopt[0] != 0
						|| usage[idx].longopt[0] != 0))
					++idx;
				descriptor = (usage[idx].shortopt == 0 ? 0 : &usage[idx]);
			}

			if (descriptor != 0) {
				Option option(descriptor, param, optarg);
				switch (descriptor->check_arg(option, print_errors)) {
				case ARG_ILLEGAL:
					return false; // fatal
				case ARG_OK:
					// skip one element of the argument vector, if it's a separated argument
					if (optarg != 0 && have_more_args && optarg == args[1]) {
						shift(args, nonops);
						if (numargs > 0)
							--numargs;
						++args;
					}

					// No further short options are possible after an argument
					handle_short_options = false;

					break;
				case ARG_IGNORE:
				case ARG_NONE:
					option.arg = 0;
					break;
				}

				if (!action.perform(option))
					return false;
			}

		} while (handle_short_options);

		shift(args, nonops);
		++args;
		if (numargs > 0)
			--numargs;

	} // while

	if (numargs > 0 && *args == 0) // It's a bug in the caller if numargs is greater than the actual number
		numargs = 0; // of arguments, but as a service to the user we fix this if we spot it.

	if (numargs < 0) // if we don't know the number of remaining non-option arguments
		{   // we need to count them
		numargs = 0;
		while (args[numargs] != 0)
			++numargs;
	}

	return action.finished(numargs + nonops, args - nonops);
}